

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

void __thiscall Token::Token(Token *this,TokenType type,char value1,char value2)

{
  char value2_local;
  char value1_local;
  TokenType type_local;
  Token *this_local;
  
  this->mType = type;
  NumericConstant::NumericConstant(&this->mNumericValue);
  this->mCharValue = value1;
  this->mCharValue2 = value1;
  std::__cxx11::string::string((string *)&this->mIdentifier);
  return;
}

Assistant:

Token::Token(TokenType type, char value1, char value2)
	: mType(type),
	  mNumericValue(),
	  mCharValue(value1),
	  mCharValue2(value1) {

}